

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O3

void hiberlite::access::destroy<hiberlite::KillChildren,std::__cxx11::string>
               (KillChildren *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c)

{
  pointer pcVar1;
  
  if ((c != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     (pcVar1 = (c->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar1 != &c->field_2)) {
    operator_delete(pcVar1);
  }
  operator_delete(c);
  return;
}

Assistant:

static void destroy(A& /*a*/, C* c)
	{
		delete c;
	}